

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O2

void secp256k1_keyagg_cache_save
               (secp256k1_musig_keyagg_cache *cache,secp256k1_keyagg_cache_internal *cache_i)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  cache->data[0] = 0xf4;
  cache->data[1] = 0xad;
  cache->data[2] = 0xbb;
  cache->data[3] = 0xdf;
  secp256k1_ge_to_bytes(cache->data + 4,&cache_i->pk);
  secp256k1_ge_to_bytes_ext(cache->data + 0x44,&cache_i->second_pk);
  uVar1 = *(undefined8 *)cache_i->pks_hash;
  uVar2 = *(undefined8 *)(cache_i->pks_hash + 8);
  uVar3 = *(undefined8 *)(cache_i->pks_hash + 0x18);
  *(undefined8 *)(cache->data + 0x94) = *(undefined8 *)(cache_i->pks_hash + 0x10);
  *(undefined8 *)(cache->data + 0x9c) = uVar3;
  *(undefined8 *)(cache->data + 0x84) = uVar1;
  *(undefined8 *)(cache->data + 0x8c) = uVar2;
  cache->data[0xa4] = (uchar)cache_i->parity_acc;
  secp256k1_scalar_get_b32(cache->data + 0xa5,&cache_i->tweak);
  return;
}

Assistant:

static void secp256k1_keyagg_cache_save(secp256k1_musig_keyagg_cache *cache, const secp256k1_keyagg_cache_internal *cache_i) {
    unsigned char *ptr = cache->data;
    memcpy(ptr, secp256k1_musig_keyagg_cache_magic, 4);
    ptr += 4;
    secp256k1_ge_to_bytes(ptr, &cache_i->pk);
    ptr += 64;
    secp256k1_ge_to_bytes_ext(ptr, &cache_i->second_pk);
    ptr += 64;
    memcpy(ptr, cache_i->pks_hash, 32);
    ptr += 32;
    *ptr = cache_i->parity_acc;
    ptr += 1;
    secp256k1_scalar_get_b32(ptr, &cache_i->tweak);
}